

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

iterator __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
          (intrusive_list<(anonymous_namespace)::TestObject> *this,iterator pos,
          unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
          *node)

{
  size_t *psVar1;
  TestObject *pTVar2;
  intrusive_list<(anonymous_namespace)::TestObject> *in_RAX;
  TestObject *pTVar3;
  TestObject *pTVar4;
  iterator iVar5;
  
  pTVar4 = pos.node_;
  pTVar2 = (node->_M_t).
           super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl;
  if (((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ !=
       (TestObject *)0x0) ||
     ((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ !=
      (TestObject *)0x0)) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x205,
                  "typename intrusive_list<T>::iterator wabt::intrusive_list<(anonymous namespace)::TestObject>::insert(iterator, std::unique_ptr<T>) [T = (anonymous namespace)::TestObject]"
                 );
  }
  if (pos.list_ != this) {
    __assert_fail("list_ == rhs.list_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0xbc,
                  "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator==(iterator) const [T = (anonymous namespace)::TestObject]"
                 );
  }
  (node->_M_t).
  super___uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl =
       (TestObject *)0x0;
  if (pTVar4 == (TestObject *)0x0) {
    if (((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ !=
         (TestObject *)0x0) ||
       ((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ !=
        (TestObject *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<(anonymous namespace)::TestObject>::push_back(std::unique_ptr<T>) [T = (anonymous namespace)::TestObject]"
                   );
    }
    pTVar3 = this->last_;
    pTVar4 = (TestObject *)this;
    if (pTVar3 != (TestObject *)0x0) {
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
      pTVar4 = pTVar3;
    }
    (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
    this->last_ = pTVar2;
    psVar1 = &this->size_;
    *psVar1 = *psVar1 + 1;
    if (*psVar1 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                    ,0x192,
                    "typename intrusive_list<T>::reference wabt::intrusive_list<(anonymous namespace)::TestObject>::back() [T = (anonymous namespace)::TestObject]"
                   );
    }
  }
  else {
    pTVar3 = (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar4;
    if (pTVar3 == (TestObject *)0x0) {
      pTVar3 = (TestObject *)this;
    }
    (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
    (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar2;
    this->size_ = this->size_ + 1;
  }
  iVar5.node_ = pTVar4;
  iVar5.list_ = in_RAX;
  return iVar5;
}

Assistant:

inline typename intrusive_list<T>::iterator intrusive_list<T>::insert(
    iterator pos,
    std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p;
  if (pos == end()) {
    push_back(std::move(node));
    node_p = &back();
  } else {
    node_p = node.release();
    node_p->prev_ = pos->prev_;
    node_p->next_ = &*pos;
    if (pos->prev_) {
      pos->prev_->next_ = node_p;
    } else {
      first_ = node_p;
    }
    pos->prev_ = node_p;
    size_++;
  }
  return iterator(*this, node_p);
}